

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv_udp_connect(uv_udp_t *handle,sockaddr *addr)

{
  byte *pbVar1;
  int iVar2;
  int *piVar3;
  socklen_t __len;
  
  iVar2 = -0x16;
  if (handle->type == UV_UDP) {
    if (addr == (sockaddr *)0x0) {
      iVar2 = -0x6b;
      if ((handle->flags & 0x2000000) != 0) {
        iVar2 = uv__udp_disconnect(handle);
        return iVar2;
      }
    }
    else {
      if (addr->sa_family == 2) {
        __len = 0x10;
      }
      else {
        if (addr->sa_family != 10) {
          return -0x16;
        }
        __len = 0x1c;
      }
      iVar2 = -0x6a;
      if ((handle->flags & 0x2000000) == 0) {
        iVar2 = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0);
        if (iVar2 == 0) {
          piVar3 = __errno_location();
          do {
            *piVar3 = 0;
            iVar2 = connect((handle->io_watcher).fd,(sockaddr *)addr,__len);
            if (iVar2 != -1) break;
          } while (*piVar3 == 4);
          if (iVar2 == 0) {
            pbVar1 = (byte *)((long)&handle->flags + 3);
            *pbVar1 = *pbVar1 | 2;
            iVar2 = 0;
          }
          else {
            iVar2 = -*piVar3;
          }
        }
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int uv_udp_connect(uv_udp_t* handle, const struct sockaddr* addr) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  /* Disconnect the handle */
  if (addr == NULL) {
    if (!(handle->flags & UV_HANDLE_UDP_CONNECTED))
      return UV_ENOTCONN;

    return uv__udp_disconnect(handle);
  }

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  if (handle->flags & UV_HANDLE_UDP_CONNECTED)
    return UV_EISCONN;

  return uv__udp_connect(handle, addr, addrlen);
}